

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.c
# Opt level: O2

cn_cbor * cn_cbor_tag_create(int tag,cn_cbor *child,cn_cbor_errback *perr)

{
  cn_cbor *pcVar1;
  
  pcVar1 = (cn_cbor *)calloc(1,0x38);
  if (pcVar1 == (cn_cbor *)0x0) {
    if (perr != (cn_cbor_errback *)0x0) {
      perr->err = CN_CBOR_ERR_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar1->type = CN_CBOR_TAG;
    pcVar1->v = (anon_union_8_7_1acfe125_for_v)(long)tag;
    pcVar1->first_child = child;
    child->parent = pcVar1;
  }
  return pcVar1;
}

Assistant:

cn_cbor * cn_cbor_tag_create(int tag, cn_cbor * child, CBOR_CONTEXT_COMMA cn_cbor_errback * perr)
{
	cn_cbor * pcnTag = CN_CALLOC(context);
	if (pcnTag == NULL) {
		if (perr != NULL) perr->err = CN_CBOR_ERR_OUT_OF_MEMORY;
		return NULL;
	}

	pcnTag->type = CN_CBOR_TAG;
	pcnTag->v.sint = tag;
	pcnTag->first_child = child;
	child->parent = pcnTag;

	return pcnTag;
}